

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Skeleton::drag
          (Skeleton *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  Vector3D local_138;
  Matrix4x4 local_120;
  Vector4D local_a0;
  double local_80;
  double w;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [8];
  Vector4D q;
  Matrix4x4 *modelViewProj_local;
  double dy_local;
  double dx_local;
  double y_local;
  double x_local;
  Skeleton *this_local;
  
  q.w = (double)modelViewProj;
  Vector4D::Vector4D((Vector4D *)local_58,&(this->super_SceneObject).position,1.0);
  Matrix4x4::operator*((Vector4D *)&w,(Matrix4x4 *)q.w,(Vector4D *)local_58);
  local_58 = (undefined1  [8])w;
  q.x = local_70;
  q.y = local_68;
  q.z = local_60;
  local_80 = local_60;
  Vector4D::operator/=((Vector4D *)local_58,&local_80);
  local_58 = (undefined1  [8])(dx + (double)local_58);
  q.x = dy + q.x;
  Vector4D::operator*=((Vector4D *)local_58,&local_80);
  Matrix4x4::inv(&local_120,(Matrix4x4 *)q.w);
  Matrix4x4::operator*(&local_a0,&local_120,(Vector4D *)local_58);
  local_58 = (undefined1  [8])local_a0.x;
  q.x = local_a0.y;
  q.y = local_a0.z;
  q.z = local_a0.w;
  Vector4D::to3D(&local_138,(Vector4D *)local_58);
  (this->super_SceneObject).position.x = local_138.x;
  (this->super_SceneObject).position.y = local_138.y;
  (this->super_SceneObject).position.z = local_138.z;
  return;
}

Assistant:

void Skeleton::drag(double x, double y, double dx, double dy, const Matrix4x4& modelViewProj)
  {
    Vector4D q(position, 1.);

    // Transform into clip space
    q = modelViewProj * q;
    double w = q.w;
    q /= w;

    // Shift by (dx, dy).
    q.x += dx;
    q.y += dy;

    // Transform back into model space
    q *= w;
    q = modelViewProj.inv() * q;

    position = q.to3D();
  }